

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O1

TPZSBMatrix<std::complex<long_double>_> * __thiscall
TPZSBMatrix<std::complex<long_double>_>::operator-=
          (TPZSBMatrix<std::complex<long_double>_> *this,TPZSBMatrix<std::complex<long_double>_> *A)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZSBMatrix<std::complex<long_double>_> local_60;
  
  iVar1 = (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0xc])();
  iVar2 = (*(A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  if ((CONCAT44(extraout_var,iVar1) != CONCAT44(extraout_var_00,iVar2)) || (this->fBand != A->fBand)
     ) {
    TPZMatrix<std::complex<long_double>_>::Error
              ("TPZSBMatrix<TVar> &TPZSBMatrix<std::complex<long double>>::operator-=(const TPZSBMatrix<TVar> &) [TVar = std::complex<long double>]"
               ,"operator+( TPZSBMatrix ) <incompatible dimensions>");
  }
  operator-(&local_60,this,A);
  TPZMatrix<std::complex<long_double>_>::operator=
            (&this->super_TPZMatrix<std::complex<long_double>_>,
             &local_60.super_TPZMatrix<std::complex<long_double>_>);
  TPZVec<std::complex<long_double>_>::operator=(&this->fDiag,&local_60.fDiag);
  this->fBand = local_60.fBand;
  ~TPZSBMatrix(&local_60,&TPZSBMatrix<std::complex<long_double>>::VTT);
  return this;
}

Assistant:

TPZSBMatrix<TVar> &
TPZSBMatrix<TVar>::operator-=(const TPZSBMatrix<TVar> &A )
{
    if ( this->Dim() != A.Dim() || fBand != A.fBand)
       this->Error(__PRETTY_FUNCTION__,"operator+( TPZSBMatrix ) <incompatible dimensions>" );
    *this = *this-A;
    return *this;
}